

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

bool __thiscall soul::heart::PureFunctionCall::mayHaveSideEffects(PureFunctionCall *this)

{
  pool_ref<soul::heart::Expression> *ppVar1;
  size_t sVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  
  bVar3 = Function::mayHaveSideEffects(this->function);
  bVar5 = true;
  if (!bVar3) {
    ppVar1 = (this->arguments).items;
    sVar2 = (this->arguments).numActive;
    lVar6 = 0;
    do {
      bVar3 = sVar2 << 3 == lVar6;
      bVar5 = !bVar3;
      if (bVar3) {
        return bVar5;
      }
      cVar4 = (**(code **)(**(long **)((long)&ppVar1->object + lVar6) + 0x50))();
      lVar6 = lVar6 + 8;
    } while (cVar4 == '\0');
  }
  return bVar5;
}

Assistant:

bool mayHaveSideEffects() const override
        {
            if (function.mayHaveSideEffects())
                return true;

            for (auto a : arguments)
                if (a->mayHaveSideEffects())
                    return true;

            return false;
        }